

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O0

void * mpp_mem_pool_get_f(char *caller,MppMemPool pool)

{
  list_head *entry;
  int iVar1;
  list_head *local_30;
  void *ptr;
  MppMemPoolNode *node;
  MppMemPoolImpl *impl;
  MppMemPool pool_local;
  char *caller_local;
  
  local_30 = (list_head *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)((long)pool + 0x18));
  if ((mpp_mem_pool_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_mem_pool","pool %d get used:unused [%d:%d] from %s",(char *)0x0,
               *(undefined8 *)((long)pool + 0x10),(ulong)*(uint *)((long)pool + 0x70),
               *(undefined4 *)((long)pool + 0x74),caller);
  }
  iVar1 = list_empty((list_head *)((long)pool + 0x60));
  if (iVar1 == 0) {
    entry = *(list_head **)((long)pool + 0x60);
    ptr = &entry[-1].prev;
    if ((list_head **)ptr != (list_head **)0x0) {
      list_del_init(entry);
      list_add_tail(entry,(list_head *)((long)pool + 0x50));
      *(int *)((long)pool + 0x74) = *(int *)((long)pool + 0x74) + -1;
      *(int *)((long)pool + 0x70) = *(int *)((long)pool + 0x70) + 1;
      local_30 = entry[1].next;
      *(void **)ptr = ptr;
      goto LAB_0011ad1c;
    }
  }
  ptr = mpp_osal_malloc("mpp_mem_pool_get_f",*(long *)((long)pool + 0x10) + 0x28);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,"mpp_mem_pool","failed to create node from size %d pool\n","mpp_mem_pool_get_f",
               *(undefined8 *)((long)pool + 0x10));
  }
  else {
    *(void **)ptr = ptr;
    *(long *)((long)ptr + 0x18) = (long)ptr + 0x28;
    *(undefined8 *)((long)ptr + 0x20) = *(undefined8 *)((long)pool + 0x10);
    *(long *)((long)ptr + 8) = (long)ptr + 8;
    *(long *)((long)ptr + 0x10) = (long)ptr + 8;
    list_add_tail((list_head *)((long)ptr + 8),(list_head *)((long)pool + 0x50));
    *(int *)((long)pool + 0x70) = *(int *)((long)pool + 0x70) + 1;
    local_30 = *(list_head **)((long)ptr + 0x18);
  }
LAB_0011ad1c:
  pthread_mutex_unlock((pthread_mutex_t *)((long)pool + 0x18));
  if (ptr != (void *)0x0) {
    memset(*(void **)((long)ptr + 0x18),0,*(size_t *)((long)ptr + 0x20));
  }
  return local_30;
}

Assistant:

void *mpp_mem_pool_get_f(const char *caller, MppMemPool pool)
{
    MppMemPoolImpl *impl = (MppMemPoolImpl *)pool;
    MppMemPoolNode *node = NULL;
    void* ptr = NULL;

    pthread_mutex_lock(&impl->lock);

    mem_pool_dbg_flow("pool %d get used:unused [%d:%d] from %s", impl->size,
                      impl->used_count, impl->unused_count, caller);

    if (!list_empty(&impl->unused)) {
        node = list_first_entry(&impl->unused, MppMemPoolNode, list);
        if (node) {
            list_del_init(&node->list);
            list_add_tail(&node->list, &impl->used);
            impl->unused_count--;
            impl->used_count++;
            ptr = node->ptr;
            node->check = node;
            goto DONE;
        }
    }

    node = mpp_malloc_size(MppMemPoolNode, sizeof(MppMemPoolNode) + impl->size);
    if (NULL == node) {
        mpp_err_f("failed to create node from size %d pool\n", impl->size);
        goto DONE;
    }

    node->check = node;
    node->ptr = (void *)(node + 1);
    node->size = impl->size;
    INIT_LIST_HEAD(&node->list);
    list_add_tail(&node->list, &impl->used);
    impl->used_count++;
    ptr = node->ptr;

DONE:
    pthread_mutex_unlock(&impl->lock);
    if (node)
        memset(node->ptr, 0 , node->size);
    return ptr;
}